

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts3SegReaderCursor
              (Fts3Table *p,int iLangid,int iIndex,int iLevel,char *zTerm,int nTerm,int isPrefix,
              int isScan,Fts3MultiSegReader *pCsr)

{
  int iVar1;
  
  *(undefined8 *)&pCsr->nTerm = 0;
  pCsr->aDoclist = (char *)0x0;
  *(undefined8 *)&pCsr->bLookup = 0;
  pCsr->zTerm = (char *)0x0;
  pCsr->nBuffer = 0;
  pCsr->iColFilter = 0;
  pCsr->bRestart = 0;
  pCsr->nCost = 0;
  *(undefined8 *)&pCsr->nDoclist = 0;
  pCsr->pFilter = (Fts3SegFilter *)0x0;
  pCsr->aBuffer = (char *)0x0;
  pCsr->apSegment = (Fts3SegReader **)0x0;
  pCsr->nSegment = 0;
  pCsr->nAdvance = 0;
  iVar1 = fts3SegReaderCursor(p,iLangid,iIndex,iLevel,zTerm,nTerm,isPrefix,isScan,pCsr);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3SegReaderCursor(
  Fts3Table *p,                   /* FTS3 table handle */
  int iLangid,                    /* Language-id to search */
  int iIndex,                     /* Index to search (from 0 to p->nIndex-1) */
  int iLevel,                     /* Level of segments to scan */
  const char *zTerm,              /* Term to query for */
  int nTerm,                      /* Size of zTerm in bytes */
  int isPrefix,                   /* True for a prefix search */
  int isScan,                     /* True to scan from zTerm to EOF */
  Fts3MultiSegReader *pCsr       /* Cursor object to populate */
){
  assert( iIndex>=0 && iIndex<p->nIndex );
  assert( iLevel==FTS3_SEGCURSOR_ALL
      ||  iLevel==FTS3_SEGCURSOR_PENDING 
      ||  iLevel>=0
  );
  assert( iLevel<FTS3_SEGDIR_MAXLEVEL );
  assert( FTS3_SEGCURSOR_ALL<0 && FTS3_SEGCURSOR_PENDING<0 );
  assert( isPrefix==0 || isScan==0 );

  memset(pCsr, 0, sizeof(Fts3MultiSegReader));
  return fts3SegReaderCursor(
      p, iLangid, iIndex, iLevel, zTerm, nTerm, isPrefix, isScan, pCsr
  );
}